

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScene::wheelEvent(QGraphicsScene *this,QGraphicsSceneWheelEvent *wheelEvent)

{
  QGraphicsItem **ppQVar1;
  QGraphicsScenePrivate *this_00;
  long lVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemPrivate *this_01;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GraphicsItemFlags GVar7;
  FocusPolicy FVar8;
  QGraphicsScenePrivate *d;
  QWidget *pQVar9;
  QGraphicsWidget *pQVar10;
  QGraphicsItem **ppQVar11;
  QGraphicsWidget **ppQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  QPointF local_78;
  QPointF local_68;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.xp = (qreal)QGraphicsSceneWheelEvent::screenPos(wheelEvent);
  QVar13 = QGraphicsSceneWheelEvent::scenePos(wheelEvent);
  local_68.yp = QVar13.yp;
  local_68.xp = QVar13.xp;
  pQVar9 = QGraphicsSceneEvent::widget(&wheelEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition(&local_58,this_00,(QPoint *)&local_78,&local_68,pQVar9);
  lVar2 = (this_00->popupWidgets).d.size;
  if (0 < lVar2) {
    ppQVar12 = (this_00->popupWidgets).d.ptr + lVar2;
    do {
      if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) goto LAB_00609d6b;
      pQVar10 = ppQVar12[-1];
      pQVar3 = &(pQVar10->super_QGraphicsObject).super_QGraphicsItem;
      if (pQVar10 != (QGraphicsWidget *)0x0) {
        pQVar10 = (QGraphicsWidget *)pQVar3;
      }
      if ((QGraphicsWidget *)*local_58.d.ptr == pQVar10) break;
      bVar4 = QGraphicsItem::isAncestorOf(pQVar3,*local_58.d.ptr);
      if (bVar4) break;
      ppQVar12 = ppQVar12 + -1;
      QGraphicsScenePrivate::removePopup(this_00,*ppQVar12,false);
    } while ((this_00->popupWidgets).d.ptr < ppQVar12);
  }
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    ppQVar1 = local_58.d.ptr + local_58.d.size;
    bVar4 = false;
    ppQVar11 = local_58.d.ptr;
    do {
      pQVar3 = *ppQVar11;
      bVar6 = true;
      bVar5 = !bVar4;
      bVar4 = bVar6;
      if (bVar5) {
        bVar5 = QGraphicsItem::isEnabled(pQVar3);
        if (bVar5) {
          GVar7 = QGraphicsItem::flags(pQVar3);
          if ((((uint)GVar7.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                      super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0) &&
             ((((pQVar3->d_ptr).d)->field_0x168 & 2) != 0)) {
            bVar5 = QGraphicsItem::isWidget(pQVar3);
            if (bVar5) {
              FVar8 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)(pQVar3 + -1));
              if (FVar8 == WheelFocus) {
                if (pQVar3 != *(QGraphicsItem **)
                               (*(long *)(this + 8) + 0x188 +
                               (ulong)(*(int *)(*(long *)(this + 8) + 0x1b8) < 1) * 0x10)) {
                  QGraphicsItem::setFocus(pQVar3,MouseFocusReason);
                }
                goto LAB_00609ce8;
              }
            }
          }
        }
        bVar4 = false;
      }
LAB_00609ce8:
      this_01 = (pQVar3->d_ptr).d;
      QVar13 = QGraphicsSceneWheelEvent::scenePos(wheelEvent);
      local_78.yp = QVar13.yp;
      local_78.xp = QVar13.xp;
      pQVar9 = QGraphicsSceneEvent::widget(&wheelEvent->super_QGraphicsSceneEvent);
      QVar13 = QGraphicsItemPrivate::genericMapFromScene(this_01,&local_78,pQVar9);
      local_68.yp = QVar13.yp;
      local_68.xp = QVar13.xp;
      QGraphicsSceneWheelEvent::setPos(wheelEvent,&local_68);
      (wheelEvent->super_QGraphicsSceneEvent).field_0xc = 1;
      bVar5 = QGraphicsItem::isPanel(pQVar3);
      bVar6 = QGraphicsScenePrivate::sendEvent(this_00,pQVar3,(QEvent *)wheelEvent);
    } while (((!bVar6) || ((!bVar5 && ((wheelEvent->super_QGraphicsSceneEvent).field_0xc == '\0'))))
            && (ppQVar11 = ppQVar11 + 1, ppQVar11 != ppQVar1));
  }
LAB_00609d6b:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::wheelEvent(QGraphicsSceneWheelEvent *wheelEvent)
{
    Q_D(QGraphicsScene);
    const QList<QGraphicsItem *> wheelCandidates = d->itemsAtPosition(wheelEvent->screenPos(),
                                                                      wheelEvent->scenePos(),
                                                                      wheelEvent->widget());

    // Find the first popup under the mouse (including the popup's descendants) starting from the last.
    // Remove all popups after the one found, or all or them if no popup is under the mouse.
    // Then continue with the event.
    QList<QGraphicsWidget *>::const_iterator iter = d->popupWidgets.constEnd();
    while (iter > d->popupWidgets.constBegin() && !wheelCandidates.isEmpty()) {
        --iter;
        if (wheelCandidates.first() == *iter || (*iter)->isAncestorOf(wheelCandidates.first()))
            break;
        d->removePopup(*iter);
    }

    bool hasSetFocus = false;
    for (QGraphicsItem *item : wheelCandidates) {
        if (!hasSetFocus && item->isEnabled()
            && ((item->flags() & QGraphicsItem::ItemIsFocusable) && item->d_ptr->mouseSetsFocus)) {
            if (item->isWidget() && static_cast<QGraphicsWidget *>(item)->focusPolicy() == Qt::WheelFocus) {
                hasSetFocus = true;
                if (item != focusItem())
                    setFocusItem(item, Qt::MouseFocusReason);
            }
        }

        wheelEvent->setPos(item->d_ptr->genericMapFromScene(wheelEvent->scenePos(),
                                                            wheelEvent->widget()));
        wheelEvent->accept();
        bool isPanel = item->isPanel();
        bool ret = d->sendEvent(item, wheelEvent);

        if (ret && (isPanel || wheelEvent->isAccepted()))
            break;
    }
}